

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::ComputeCompileFeatures(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string *psVar2;
  cmValue currentLangStandardValue;
  mapped_type *__lhs;
  pointer feature;
  cmStandardLevelResolver standardResolver;
  string lang;
  string newRequiredStandard;
  string key;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  features;
  cmStandardLevelResolver local_118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_110;
  string local_108;
  cmAlphaNum local_e8;
  string local_b8;
  string local_98;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  cmAlphaNum local_60;
  
  local_118.Makefile = this->Makefile;
  GetCompileFeatures(&local_78,this,config);
  local_110 = &this->LanguageStandardMap;
  feature = local_78.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (feature ==
        local_78.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003dde46:
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_78);
      return feature ==
             local_78.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
    bVar1 = cmStandardLevelResolver::CompileFeatureKnown
                      (&local_118,psVar2,&feature->Value,&local_108,(string *)0x0);
    if (!bVar1) {
LAB_003dde3c:
      std::__cxx11::string::~string((string *)&local_108);
      goto LAB_003dde46;
    }
    cmsys::SystemTools::UpperCase(&local_b8,config);
    local_e8.View_._M_len = local_b8._M_string_length;
    local_e8.View_._M_str = local_b8._M_dataplus._M_p;
    local_60.View_._M_len = 1;
    local_60.View_._M_str = local_60.Digits_;
    local_60.Digits_[0] = '-';
    cmStrCat<std::__cxx11::string>(&local_98,&local_e8,&local_60,&local_108);
    std::__cxx11::string::~string((string *)&local_b8);
    currentLangStandardValue.Value = &GetLanguageStandardProperty(this,&local_108,config)->Value;
    local_e8.View_._M_len = (size_t)local_e8.Digits_;
    local_e8.View_._M_str = (char *)0x0;
    local_e8.Digits_[0] = '\0';
    psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
    bVar1 = cmStandardLevelResolver::GetNewRequiredStandard
                      (&local_118,psVar2,&feature->Value,currentLangStandardValue,
                       (string *)&local_e8,(string *)0x0);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_003dde3c;
    }
    if (local_e8.View_._M_str != (char *)0x0) {
      __lhs = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](local_110,&local_98);
      bVar1 = std::operator!=(&__lhs->Value,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_e8);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)__lhs);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                  (&__lhs->Backtraces);
      }
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      emplace_back<cmListFileBacktrace_const&>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &__lhs->Backtraces,&feature->Backtrace);
    }
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_108);
    feature = feature + 1;
  } while( true );
}

Assistant:

bool cmGeneratorTarget::ComputeCompileFeatures(std::string const& config) const
{
  // Compute the language standard based on the compile features.
  cmStandardLevelResolver standardResolver(this->Makefile);
  std::vector<BT<std::string>> features = this->GetCompileFeatures(config);
  for (BT<std::string> const& f : features) {
    std::string lang;
    if (!standardResolver.CompileFeatureKnown(this->Target->GetName(), f.Value,
                                              lang, nullptr)) {
      return false;
    }

    std::string key = cmStrCat(cmSystemTools::UpperCase(config), '-', lang);
    cmValue currentLanguageStandard = this->GetLanguageStandard(lang, config);

    std::string newRequiredStandard;
    if (!standardResolver.GetNewRequiredStandard(
          this->Target->GetName(), f.Value, currentLanguageStandard,
          newRequiredStandard)) {
      return false;
    }

    if (!newRequiredStandard.empty()) {
      BTs<std::string>& languageStandardProperty =
        this->LanguageStandardMap[key];
      if (languageStandardProperty.Value != newRequiredStandard) {
        languageStandardProperty.Value = newRequiredStandard;
        languageStandardProperty.Backtraces.clear();
      }
      languageStandardProperty.Backtraces.emplace_back(f.Backtrace);
    }
  }

  return true;
}